

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_clock.c
# Opt level: O0

void mk_clock_log_set_time(time_t utime,mk_server *server)

{
  char *__s;
  tm *__tp;
  undefined1 local_58 [8];
  tm result;
  char *time_string;
  mk_server *server_local;
  time_t utime_local;
  
  server_local = (mk_server *)utime;
  __s = _next_buffer(&server->clock_context->log_current_time,
                     server->clock_context->log_time_buffers);
  server->clock_context->log_current_utime = (time_t)server_local;
  result.tm_zone = __s;
  __tp = localtime_r((time_t *)&server_local,(tm *)local_58);
  strftime(__s,0x1e,"[%d/%b/%G %T %z]",__tp);
  (server->clock_context->log_current_time).data = result.tm_zone;
  return;
}

Assistant:

static void mk_clock_log_set_time(time_t utime, struct mk_server *server)
{
    char *time_string;
    struct tm result;

    time_string = _next_buffer(&server->clock_context->log_current_time, server->clock_context->log_time_buffers);
    server->clock_context->log_current_utime = utime;

    strftime(time_string, LOG_TIME_BUFFER_SIZE, "[%d/%b/%G %T %z]",
             localtime_r(&utime, &result));

    server->clock_context->log_current_time.data = time_string;
}